

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.hpp
# Opt level: O3

void __thiscall
asio::ssl::stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>::
stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&>
          (stream<asio::basic_stream_socket<asio::ip::tcp,asio::any_io_executor>&> *this,
          basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> *arg,context *ctx)

{
  SSL_CTX *context;
  any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  local_50;
  
  *(basic_stream_socket<asio::ip::tcp,_asio::any_io_executor> **)this = arg;
  context = ctx->handle_;
  execution::
  any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
  ::any_executor(&local_50,
                 &(arg->super_basic_socket<asio::ip::tcp,_asio::any_io_executor>).impl_.executor_.
                  super_any_executor<asio::execution::context_as_t<asio::execution_context_&>,_asio::execution::detail::blocking::never_t<0>,_asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>_>,_asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>_>_>
                );
  detail::stream_core::stream_core<asio::any_io_executor>
            ((stream_core *)(this + 8),context,(any_io_executor *)&local_50);
  (*(local_50.super_any_executor_base.object_fns_)->destroy)(&local_50.super_any_executor_base);
  return;
}

Assistant:

stream(Arg&& arg, context& ctx)
    : next_layer_(ASIO_MOVE_CAST(Arg)(arg)),
      core_(ctx.native_handle(), next_layer_.lowest_layer().get_executor())
  {
  }